

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,TiXmlDeclaration *copy)

{
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,DECLARATION);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_0019c630;
  (this->version).rep_ = (Rep *)TiXmlString::nullrep_;
  (this->encoding).rep_ = (Rep *)TiXmlString::nullrep_;
  (this->standalone).rep_ = (Rep *)TiXmlString::nullrep_;
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration(const TiXmlDeclaration& copy) :
	TiXmlNode(TiXmlNode::DECLARATION) {
	copy.CopyTo(this);
}